

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_verifycrl(mbedtls_x509_crt *crt,mbedtls_x509_crt *ca,mbedtls_x509_crl *crl_list,
                      mbedtls_x509_crt_profile *profile)

{
  mbedtls_pk_type_t type;
  mbedtls_md_type_t md_alg;
  size_t sVar1;
  size_t __n;
  size_t ilen;
  void *options;
  size_t sig_len;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info_00;
  mbedtls_md_info_t *md_info;
  uchar hash [64];
  int flags;
  mbedtls_x509_crt_profile *profile_local;
  mbedtls_x509_crl *crl_list_local;
  mbedtls_x509_crt *ca_local;
  mbedtls_x509_crt *crt_local;
  
  hash[0x3c] = '\0';
  hash[0x3d] = '\0';
  hash[0x3e] = '\0';
  hash[0x3f] = '\0';
  profile_local = (mbedtls_x509_crt_profile *)crl_list;
  if (ca == (mbedtls_x509_crt *)0x0) {
    crt_local._4_4_ = 0;
  }
  else {
    while (profile_local != (mbedtls_x509_crt_profile *)0x0) {
      if (((profile_local[3].allowed_mds == 0) ||
          (sVar1._0_4_ = profile_local[5].allowed_curves,
          sVar1._4_4_ = profile_local[5].rsa_min_bitlen, sVar1 != (ca->subject_raw).len)) ||
         (__n._0_4_ = profile_local[5].allowed_curves, __n._4_4_ = profile_local[5].rsa_min_bitlen,
         iVar3 = memcmp(*(void **)(profile_local + 6),(ca->subject_raw).p,__n), iVar3 != 0)) {
        profile_local = *(mbedtls_x509_crt_profile **)&profile_local[0x19].allowed_curves;
      }
      else {
        iVar3 = mbedtls_x509_crt_check_key_usage(ca,2);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x10;
          break;
        }
        iVar3 = x509_profile_check_md_alg(profile,profile_local[0x18].allowed_curves);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x20000;
        }
        iVar3 = x509_profile_check_pk_alg(profile,profile_local[0x18].rsa_min_bitlen);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x40000;
        }
        md_info_00 = mbedtls_md_info_from_type(profile_local[0x18].allowed_curves);
        if (md_info_00 == (mbedtls_md_info_t *)0x0) {
          hash._60_4_ = hash._60_4_ | 0x10;
          break;
        }
        ilen._0_4_ = profile_local[2].allowed_mds;
        ilen._4_4_ = profile_local[2].allowed_pks;
        mbedtls_md(md_info_00,*(uchar **)&profile_local[2].allowed_curves,ilen,(uchar *)&md_info);
        iVar3 = x509_profile_check_key(profile,profile_local[0x18].rsa_min_bitlen,&ca->pk);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x10000;
        }
        type = profile_local[0x18].rsa_min_bitlen;
        options = *(void **)(profile_local + 0x19);
        md_alg = profile_local[0x18].allowed_curves;
        bVar2 = mbedtls_md_get_size(md_info_00);
        sig_len._0_4_ = profile_local[0x17].allowed_curves;
        sig_len._4_4_ = profile_local[0x17].rsa_min_bitlen;
        iVar3 = mbedtls_pk_verify_ext
                          (type,options,&ca->pk,md_alg,(uchar *)&md_info,(ulong)bVar2,
                           *(uchar **)(profile_local + 0x18),sig_len);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x10;
          break;
        }
        iVar3 = mbedtls_x509_time_is_past((mbedtls_x509_time *)(profile_local + 0xc));
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x20;
        }
        iVar3 = mbedtls_x509_time_is_future((mbedtls_x509_time *)&profile_local[10].allowed_curves);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 0x400;
        }
        iVar3 = mbedtls_x509_crt_is_revoked(crt,(mbedtls_x509_crl *)profile_local);
        if (iVar3 != 0) {
          hash._60_4_ = hash._60_4_ | 2;
          break;
        }
        profile_local = *(mbedtls_x509_crt_profile **)&profile_local[0x19].allowed_curves;
      }
    }
    crt_local._4_1_ = hash[0x3c];
    crt_local._5_1_ = hash[0x3d];
    crt_local._6_1_ = hash[0x3e];
    crt_local._7_1_ = hash[0x3f];
  }
  return crt_local._4_4_;
}

Assistant:

static int x509_crt_verifycrl( mbedtls_x509_crt *crt, mbedtls_x509_crt *ca,
                               mbedtls_x509_crl *crl_list,
                               const mbedtls_x509_crt_profile *profile )
{
    int flags = 0;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;

    if( ca == NULL )
        return( flags );

    while( crl_list != NULL )
    {
        if( crl_list->version == 0 ||
            crl_list->issuer_raw.len != ca->subject_raw.len ||
            memcmp( crl_list->issuer_raw.p, ca->subject_raw.p,
                    crl_list->issuer_raw.len ) != 0 )
        {
            crl_list = crl_list->next;
            continue;
        }

        /*
         * Check if the CA is configured to sign CRLs
         */
#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
        if( mbedtls_x509_crt_check_key_usage( ca, MBEDTLS_X509_KU_CRL_SIGN ) != 0 )
        {
            flags |= MBEDTLS_X509_BADCRL_NOT_TRUSTED;
            break;
        }
#endif

        /*
         * Check if CRL is correctly signed by the trusted CA
         */
        if( x509_profile_check_md_alg( profile, crl_list->sig_md ) != 0 )
            flags |= MBEDTLS_X509_BADCRL_BAD_MD;

        if( x509_profile_check_pk_alg( profile, crl_list->sig_pk ) != 0 )
            flags |= MBEDTLS_X509_BADCRL_BAD_PK;

        md_info = mbedtls_md_info_from_type( crl_list->sig_md );
        if( md_info == NULL )
        {
            /*
             * Cannot check 'unknown' hash
             */
            flags |= MBEDTLS_X509_BADCRL_NOT_TRUSTED;
            break;
        }

        mbedtls_md( md_info, crl_list->tbs.p, crl_list->tbs.len, hash );

        if( x509_profile_check_key( profile, crl_list->sig_pk, &ca->pk ) != 0 )
            flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

        if( mbedtls_pk_verify_ext( crl_list->sig_pk, crl_list->sig_opts, &ca->pk,
                           crl_list->sig_md, hash, mbedtls_md_get_size( md_info ),
                           crl_list->sig.p, crl_list->sig.len ) != 0 )
        {
            flags |= MBEDTLS_X509_BADCRL_NOT_TRUSTED;
            break;
        }

        /*
         * Check for validity of CRL (Do not drop out)
         */
        if( mbedtls_x509_time_is_past( &crl_list->next_update ) )
            flags |= MBEDTLS_X509_BADCRL_EXPIRED;

        if( mbedtls_x509_time_is_future( &crl_list->this_update ) )
            flags |= MBEDTLS_X509_BADCRL_FUTURE;

        /*
         * Check if certificate is revoked
         */
        if( mbedtls_x509_crt_is_revoked( crt, crl_list ) )
        {
            flags |= MBEDTLS_X509_BADCERT_REVOKED;
            break;
        }

        crl_list = crl_list->next;
    }

    return( flags );
}